

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

gc_heap_ptr<mjs::gc_function> __thiscall
mjs::gc_heap::allocate_and_construct<mjs::gc_function>(gc_heap *this,size_t num_bytes)

{
  slot_allocation_header *psVar1;
  char *pcVar2;
  size_t in_RDX;
  undefined8 extraout_RDX;
  int __c;
  allocation_result aVar3;
  gc_heap_ptr<mjs::gc_function> gVar4;
  undefined1 local_30 [8];
  allocation_result a;
  size_t num_bytes_local;
  gc_heap *this_local;
  
  aVar3 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),in_RDX);
  __c = (int)in_RDX;
  a._0_8_ = aVar3.obj;
  local_30._0_4_ = aVar3.pos;
  psVar1 = allocation_result::hdr((allocation_result *)local_30);
  if (psVar1->type == 0xffffffff) {
    pcVar2 = (char *)a._0_8_;
    gc_type_info_registration<mjs::gc_function>::construct<>((void *)a._0_8_);
    pcVar2 = gc_type_info_registration<mjs::gc_function>::index(pcVar2,__c);
    psVar1 = allocation_result::hdr((allocation_result *)local_30);
    psVar1->type = (uint32_t)pcVar2;
    gc_heap_ptr<mjs::gc_function>::gc_heap_ptr
              ((gc_heap_ptr<mjs::gc_function> *)this,(gc_heap *)num_bytes,local_30._0_4_);
    gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar4.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::gc_function>)gVar4.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_function, Args = <>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}